

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O2

int32_t __thiscall fasttext::Dictionary::find(Dictionary *this,string *w,uint32_t h)

{
  bool bVar1;
  pointer piVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  piVar2 = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (ulong)((long)(this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar2) >> 2;
  uVar4 = (ulong)h % (uVar5 & 0xffffffff);
  while( true ) {
    iVar3 = (int)uVar4;
    if ((long)piVar2[iVar3] == -1) {
      return iVar3;
    }
    bVar1 = std::operator!=(&(this->words_).
                             super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
                             _M_impl.super__Vector_impl_data._M_start[piVar2[iVar3]].word,w);
    if (!bVar1) break;
    uVar4 = (long)(iVar3 + 1) % (long)(int)uVar5 & 0xffffffff;
    piVar2 = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  return iVar3;
}

Assistant:

int32_t Dictionary::find(const std::string& w, uint32_t h) const {
  int32_t word2intsize = word2int_.size();
  int32_t id = h % word2intsize;
  while (word2int_[id] != -1 && words_[word2int_[id]].word != w) {
    id = (id + 1) % word2intsize;
  }
  return id;
}